

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O0

int UnityGetAudioEffectDefinitions(UnityAudioEffectDefinition ***definitionptr)

{
  long lVar1;
  int local_14;
  int n;
  UnityAudioEffectDefinition ***definitionptr_local;
  
  if (UnityGetAudioEffectDefinitions::numeffects == 0) {
    UnityGetAudioEffectDefinitions::numeffects = 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition,"Demo Equalizer",
                  Equalizer::CreateCallback,Equalizer::ReleaseCallback,Equalizer::ProcessCallback,
                  Equalizer::SetFloatParameterCallback,Equalizer::GetFloatParameterCallback,
                  Equalizer::GetFloatBufferCallback,Equalizer::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo ImpactGenerator",
                  ImpactGenerator::CreateCallback,ImpactGenerator::ReleaseCallback,
                  ImpactGenerator::ProcessCallback,ImpactGenerator::SetFloatParameterCallback,
                  ImpactGenerator::GetFloatParameterCallback,ImpactGenerator::GetFloatBufferCallback
                  ,ImpactGenerator::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo ImpulseGenerator",
                  ImpulseGenerator::CreateCallback,ImpulseGenerator::ReleaseCallback,
                  ImpulseGenerator::ProcessCallback,ImpulseGenerator::SetFloatParameterCallback,
                  ImpulseGenerator::GetFloatParameterCallback,
                  ImpulseGenerator::GetFloatBufferCallback,
                  ImpulseGenerator::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo LevelMixer",
                  LevelMixer::CreateCallback,LevelMixer::ReleaseCallback,LevelMixer::ProcessCallback
                  ,LevelMixer::SetFloatParameterCallback,LevelMixer::GetFloatParameterCallback,
                  LevelMixer::GetFloatBufferCallback,LevelMixer::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo Lofinator",
                  Lofinator::CreateCallback,Lofinator::ReleaseCallback,Lofinator::ProcessCallback,
                  Lofinator::SetFloatParameterCallback,Lofinator::GetFloatParameterCallback,
                  Lofinator::GetFloatBufferCallback,Lofinator::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo ModalFilter",
                  ModalFilter::CreateCallback,ModalFilter::ReleaseCallback,
                  ModalFilter::ProcessCallback,ModalFilter::SetFloatParameterCallback,
                  ModalFilter::GetFloatParameterCallback,ModalFilter::GetFloatBufferCallback,
                  ModalFilter::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo Multiband",
                  Multiband::CreateCallback,Multiband::ReleaseCallback,Multiband::ProcessCallback,
                  Multiband::SetFloatParameterCallback,Multiband::GetFloatParameterCallback,
                  Multiband::GetFloatBufferCallback,Multiband::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo NoiseBox",
                  NoiseBox::CreateCallback,NoiseBox::ReleaseCallback,NoiseBox::ProcessCallback,
                  NoiseBox::SetFloatParameterCallback,NoiseBox::GetFloatParameterCallback,
                  NoiseBox::GetFloatBufferCallback,NoiseBox::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo PitchDetector",
                  PitchDetector::CreateCallback,PitchDetector::ReleaseCallback,
                  PitchDetector::ProcessCallback,PitchDetector::SetFloatParameterCallback,
                  PitchDetector::GetFloatParameterCallback,PitchDetector::GetFloatBufferCallback,
                  PitchDetector::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo RingModulator",
                  RingModulator::CreateCallback,RingModulator::ReleaseCallback,
                  RingModulator::ProcessCallback,RingModulator::SetFloatParameterCallback,
                  RingModulator::GetFloatParameterCallback,RingModulator::GetFloatBufferCallback,
                  RingModulator::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo StereoWidener",
                  StereoWidener::CreateCallback,StereoWidener::ReleaseCallback,
                  StereoWidener::ProcessCallback,StereoWidener::SetFloatParameterCallback,
                  StereoWidener::GetFloatParameterCallback,StereoWidener::GetFloatBufferCallback,
                  StereoWidener::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo TeeBee3o3",
                  TeeBee::CreateCallback,TeeBee::ReleaseCallback,TeeBee::ProcessCallback,
                  TeeBee::SetFloatParameterCallback,TeeBee::GetFloatParameterCallback,
                  TeeBee::GetFloatBufferCallback,TeeBee::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo TeeDee9o9",
                  TeeDee::CreateCallback,TeeDee::ReleaseCallback,TeeDee::ProcessCallback,
                  TeeDee::SetFloatParameterCallback,TeeDee::GetFloatParameterCallback,
                  TeeDee::GetFloatBufferCallback,TeeDee::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo TubeResonator",
                  TubeResonator::CreateCallback,TubeResonator::ReleaseCallback,
                  TubeResonator::ProcessCallback,TubeResonator::SetFloatParameterCallback,
                  TubeResonator::GetFloatParameterCallback,TubeResonator::GetFloatBufferCallback,
                  TubeResonator::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo Vocoder",
                  Vocoder::CreateCallback,Vocoder::ReleaseCallback,Vocoder::ProcessCallback,
                  Vocoder::SetFloatParameterCallback,Vocoder::GetFloatParameterCallback,
                  Vocoder::GetFloatBufferCallback,Vocoder::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo WahWah",
                  WahWah::CreateCallback,WahWah::ReleaseCallback,WahWah::ProcessCallback,
                  WahWah::SetFloatParameterCallback,WahWah::GetFloatParameterCallback,
                  WahWah::GetFloatBufferCallback,WahWah::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo ConvolutionReverb",
                  ConvolutionReverb::CreateCallback,ConvolutionReverb::ReleaseCallback,
                  ConvolutionReverb::ProcessCallback,ConvolutionReverb::SetFloatParameterCallback,
                  ConvolutionReverb::GetFloatParameterCallback,
                  ConvolutionReverb::GetFloatBufferCallback,
                  ConvolutionReverb::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo CorrelationMeter",
                  CorrelationMeter::CreateCallback,CorrelationMeter::ReleaseCallback,
                  CorrelationMeter::ProcessCallback,CorrelationMeter::SetFloatParameterCallback,
                  CorrelationMeter::GetFloatParameterCallback,
                  CorrelationMeter::GetFloatBufferCallback,
                  CorrelationMeter::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo Granulator",
                  Granulator::CreateCallback,Granulator::ReleaseCallback,Granulator::ProcessCallback
                  ,Granulator::SetFloatParameterCallback,Granulator::GetFloatParameterCallback,
                  Granulator::GetFloatBufferCallback,Granulator::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo LoudnessMeter",
                  LoudnessMeter::CreateCallback,LoudnessMeter::ReleaseCallback,
                  LoudnessMeter::ProcessCallback,LoudnessMeter::SetFloatParameterCallback,
                  LoudnessMeter::GetFloatParameterCallback,LoudnessMeter::GetFloatBufferCallback,
                  LoudnessMeter::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo Oscilloscope",
                  Oscilloscope::CreateCallback,Oscilloscope::ReleaseCallback,
                  Oscilloscope::ProcessCallback,Oscilloscope::SetFloatParameterCallback,
                  Oscilloscope::GetFloatParameterCallback,Oscilloscope::GetFloatBufferCallback,
                  Oscilloscope::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo Routing",
                  Routing::CreateCallback,Routing::ReleaseCallback,Routing::ProcessCallback,
                  Routing::SetFloatParameterCallback,Routing::GetFloatParameterCallback,
                  Routing::GetFloatBufferCallback,Routing::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo Spatializer",
                  Spatializer::CreateCallback,Spatializer::ReleaseCallback,
                  Spatializer::ProcessCallback,Spatializer::SetFloatParameterCallback,
                  Spatializer::GetFloatParameterCallback,Spatializer::GetFloatBufferCallback,
                  Spatializer::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo Spatializer Reverb",
                  SpatializerReverb::CreateCallback,SpatializerReverb::ReleaseCallback,
                  SpatializerReverb::ProcessCallback,SpatializerReverb::SetFloatParameterCallback,
                  SpatializerReverb::GetFloatParameterCallback,
                  SpatializerReverb::GetFloatBufferCallback,
                  SpatializerReverb::InternalRegisterEffectDefinition);
    lVar1 = (long)UnityGetAudioEffectDefinitions::numeffects;
    UnityGetAudioEffectDefinitions::numeffects = UnityGetAudioEffectDefinitions::numeffects + 1;
    DeclareEffect(UnityGetAudioEffectDefinitions::definition + lVar1,"Demo Teleport",
                  Teleport::CreateCallback,Teleport::ReleaseCallback,Teleport::ProcessCallback,
                  Teleport::SetFloatParameterCallback,Teleport::GetFloatParameterCallback,
                  Teleport::GetFloatBufferCallback,Teleport::InternalRegisterEffectDefinition);
  }
  for (local_14 = 0; local_14 < UnityGetAudioEffectDefinitions::numeffects; local_14 = local_14 + 1)
  {
    UnityGetAudioEffectDefinitions::definitionp[local_14] =
         UnityGetAudioEffectDefinitions::definition + local_14;
  }
  *definitionptr = UnityGetAudioEffectDefinitions::definitionp;
  return UnityGetAudioEffectDefinitions::numeffects;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int AUDIO_CALLING_CONVENTION UnityGetAudioEffectDefinitions(UnityAudioEffectDefinition*** definitionptr)
{
    static UnityAudioEffectDefinition definition[256];
    static UnityAudioEffectDefinition* definitionp[256];
    static int numeffects = 0;
    if (numeffects == 0)
    {
        #include "PluginList.h"
    }
    for (int n = 0; n < numeffects; n++)
        definitionp[n] = &definition[n];
    *definitionptr = definitionp;
    return numeffects;
}